

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::GPUConversionDecodeEnabledCase::setupTest
          (GPUConversionDecodeEnabledCase *this)

{
  int height;
  string *in_RCX;
  ComparisonFunction *paramsComparisonFunction;
  WrapMode wrapS;
  Vec4 *color;
  WrapMode in_stack_fffffffffffffed8;
  FilterMode in_stack_fffffffffffffee0;
  allocator<char> local_11a;
  allocator<char> local_119;
  FilterMode in_stack_fffffffffffffee8;
  SRGBDecode in_stack_fffffffffffffef0;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  FragmentShaderParameters shaderParameters;
  ComparisonFunction comparisonFunction;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&shaderParameters,"srgbToLinearCheck",&local_119);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffee8,
             "mediump vec4 srgbToLinearCheck(in mediump vec4 texelSRGBA, in mediump vec4 texelLinear) \n{ \n\tconst int NUM_CHANNELS = 4;\tmediump vec4 texelSRGBAConverted; \n\tmediump vec4 epsilonErr = vec4(0.005); \n\tmediump vec4 testResult; \n\tfor (int idx = 0; idx < NUM_CHANNELS; idx++) \n\t{ \n\t\ttexelSRGBAConverted[idx] = pow( (texelSRGBA[idx] + 0.055) / 1.055, 1.0 / 0.4116); \n\t} \n\tif ( all(lessThan(abs(texelSRGBAConverted - texelLinear), epsilonErr)) || all(equal(texelSRGBAConverted, texelLinear)) ) \n\t{ \n\t\treturn testResult = vec4(0.0, 1.0, 0.0, 1.0); \n\t} \n\telse \n\t{ \n\t\treturn testResult = vec4(1.0, 0.0, 0.0, 1.0); \n\t} \n} \n"
             ,&local_11a);
  ComparisonFunction::ComparisonFunction
            (&comparisonFunction,(string *)&shaderParameters,
             (FunctionParameters)&stack0xfffffffffffffee8,in_RCX);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffee8);
  std::__cxx11::string::~string((string *)&shaderParameters);
  paramsComparisonFunction = &comparisonFunction;
  wrapS = CLAMP_TO_BORDER;
  color = (Vec4 *)&DAT_00000001;
  FragmentShaderParameters::FragmentShaderParameters
            (&shaderParameters,SHADEROUTPUTS_ONE,SHADERUNIFORMS_TWO,paramsComparisonFunction,
             BLENDING_NOT_REQUIRED,TOGGLING_NOT_REQUIRED);
  local_e8 = 0x3e99999a3e4ccccd;
  uStack_e0 = 0x3f8000003ecccccd;
  height = (int)paramsComparisonFunction;
  SRGBTestCase::addTexture
            (&this->super_SRGBTestCase,(TextureType)&local_e8,0,height,color,wrapS,
             in_stack_fffffffffffffed8,in_stack_fffffffffffffee0,in_stack_fffffffffffffee8,
             in_stack_fffffffffffffef0);
  local_f8 = 0x3e99999a3e4ccccd;
  uStack_f0 = 0x3f8000003ecccccd;
  SRGBTestCase::addTexture
            (&this->super_SRGBTestCase,(TextureType)&local_f8,2,height,color,wrapS,
             in_stack_fffffffffffffed8,in_stack_fffffffffffffee0,in_stack_fffffffffffffee8,
             in_stack_fffffffffffffef0);
  SRGBTestCase::addShaderProgram(&this->super_SRGBTestCase,&shaderParameters);
  (this->super_SRGBTestCase).m_py = 0;
  (this->super_SRGBTestCase).m_samplingGroup = SHADERSAMPLINGGROUP_TEXTURE;
  (this->super_SRGBTestCase).m_px = 0;
  FragmentShaderParameters::~FragmentShaderParameters(&shaderParameters);
  ComparisonFunction::~ComparisonFunction(&comparisonFunction);
  return;
}

Assistant:

void GPUConversionDecodeEnabledCase::setupTest (void)
{
	// TEST STEPS:
	//	- create and set texture_a to DECODE_SKIP_EXT and texture_b to default
	//	- store textures on GPU
	//	- in fragment shader, sample both textures using texture*() and manually perform sRGB to lRGB conversion on texture_b
	//	- in fragment shader, compare converted texture_b with texture_a
	//	- render green image for pass or red for fail

	ComparisonFunction comparisonFunction("srgbToLinearCheck", FUNCTIONPARAMETERS_TWO, getFunctionDefinitionSRGBToLinearCheck());

	FragmentShaderParameters shaderParameters(SHADEROUTPUTS_ONE, SHADERUNIFORMS_TWO, &comparisonFunction, BLENDING_NOT_REQUIRED, TOGGLING_NOT_REQUIRED);

	this->addTexture(	TEXTURETYPE_2D,
						TestDimensions::WIDTH,
						TestDimensions::HEIGHT,
						getColorReferenceLinear(),
						tcu::Sampler::MIRRORED_REPEAT_GL,
						tcu::Sampler::MIRRORED_REPEAT_GL,
						tcu::Sampler::LINEAR,
						tcu::Sampler::LINEAR,
						SRGBDECODE_SKIP_DECODE);

	this->addTexture(	TEXTURETYPE_2D,
						TestDimensions::WIDTH,
						TestDimensions::HEIGHT,
						getColorReferenceLinear(),
						tcu::Sampler::MIRRORED_REPEAT_GL,
						tcu::Sampler::MIRRORED_REPEAT_GL,
						tcu::Sampler::LINEAR,
						tcu::Sampler::LINEAR,
						SRGBDECODE_DECODE_DEFAULT);

	this->addShaderProgram(shaderParameters);

	this->setSamplingLocations(TestSamplingPositions::X_POS, TestSamplingPositions::Y_POS);

	this->setSamplingGroup(SHADERSAMPLINGGROUP_TEXTURE);
}